

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver.cpp
# Opt level: O2

int __thiscall QLocalServer::listen(QLocalServer *this,int __fd,int __n)

{
  QLocalServerPrivate *this_00;
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int iVar4;
  QLocalServerPrivate *d;
  undefined4 in_register_00000034;
  QString *pQVar5;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_30;
  
  pQVar5 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLocalServerPrivate **)&this->field_0x8;
  if ((this_00->serverName).d.size == 0) {
    if (*(long *)(pQVar5 + 0x10) == 0) {
      this_00->error = HostNotFoundError;
      local_58.size._0_4_ = 0xaaaaaaaa;
      local_58.size._4_4_ = 0xaaaaaaaa;
      local_58.d._0_4_ = 0xaaaaaaaa;
      local_58.d._4_4_ = 0xaaaaaaaa;
      local_58.ptr._0_4_ = 0xaaaaaaaa;
      local_58.ptr._4_4_ = 0xaaaaaaaa;
      latin1.m_data = "QLocalServer::listen";
      latin1.m_size = 0x14;
      QString::QString((QString *)&local_58,latin1);
      iVar4 = 0;
      tr((QString *)&local_90,"%1: Name error",(char *)0x0,-1);
      QString::arg<QString,_true>
                ((QString *)&local_78,(QString *)&local_90,(QString *)&local_58,0,(QChar)0x20);
      pDVar2 = (this_00->errorString).d.d;
      pcVar3 = (this_00->errorString).d.ptr;
      (this_00->errorString).d.d = local_78.d;
      (this_00->errorString).d.ptr = local_78.ptr;
      qVar1 = (this_00->errorString).d.size;
      (this_00->errorString).d.size = local_78.size;
      local_78.d = pDVar2;
      local_78.ptr = pcVar3;
      local_78.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    else {
      iVar4 = QLocalServerPrivate::listen(this_00,__fd,__n);
      if ((char)iVar4 == '\0') {
        QString::clear(&this_00->serverName);
        QString::clear(&this_00->fullServerName);
        iVar4 = 0;
      }
      else {
        QString::operator=(&this_00->serverName,pQVar5);
        iVar4 = (int)CONCAT71((int7)((ulong)pQVar5 >> 8),1);
      }
    }
  }
  else {
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_40 = "default";
    iVar4 = 0;
    QMessageLogger::warning
              ((char *)&local_58,"QLocalServer::listen() called when already listening");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalServer::listen(const QString &name)
{
    Q_D(QLocalServer);
    if (isListening()) {
        qWarning("QLocalServer::listen() called when already listening");
        return false;
    }

    if (name.isEmpty()) {
        d->error = QAbstractSocket::HostNotFoundError;
        QString function = "QLocalServer::listen"_L1;
        d->errorString = tr("%1: Name error").arg(function);
        return false;
    }

    if (!d->listen(name)) {
        d->serverName.clear();
        d->fullServerName.clear();
        return false;
    }

    d->serverName = name;
    return true;
}